

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_mthd.h
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdVtxXy::MthdVtxXy
          (MthdVtxXy *this,TestOptions *opt,uint32_t seed,string *name,int trapbit,uint32_t cls,
          uint32_t mthd,uint32_t num,uint32_t stride,int flags)

{
  uint32_t cls_local;
  int trapbit_local;
  string *name_local;
  uint32_t seed_local;
  TestOptions *opt_local;
  MthdVtxXy *this_local;
  
  pgraph::SingleMthdTest::SingleMthdTest
            (&this->super_SingleMthdTest,opt,seed,name,trapbit,cls,mthd,num,stride);
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test._vptr_Test
       = (_func_int **)&PTR__MthdVtxXy_003f8ca8;
  this->first = (flags & 1U) != 0;
  this->poly = (flags & 2U) != 0;
  this->draw = (flags & 4U) != 0;
  this->fract = (flags & 8U) != 0;
  this->noclip = (flags & 0x10U) != 0;
  this->ifc = (flags & 0x20U) != 0;
  this->check = (flags & 0x40U) != 0;
  this->tfc = (flags & 0x80U) != 0;
  return;
}

Assistant:

MthdVtxXy(hwtest::TestOptions &opt, uint32_t seed, const std::string &name, int trapbit, uint32_t cls, uint32_t mthd, uint32_t num, uint32_t stride, int flags)
	: SingleMthdTest(opt, seed, name, trapbit, cls, mthd, num, stride) {
		first = !!(flags & VTX_FIRST);
		poly = !!(flags & VTX_POLY);
		draw = !!(flags & VTX_DRAW);
		fract = !!(flags & VTX_FRACT);
		noclip = !!(flags & VTX_NOCLIP);
		ifc = !!(flags & VTX_IFC);
		check = !!(flags & VTX_CHECK);
		tfc = !!(flags & VTX_TFC);
	}